

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::rescale_double_size_supersample<float>(image *this,ConstPtr *img)

{
  bool bVar1;
  int width;
  int iVar2;
  int iVar3;
  int chans;
  int iVar4;
  int iVar5;
  int iVar6;
  ImageBase *pIVar7;
  TypedImageBase<float> *this_00;
  element_type *peVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  element_type *this_01;
  float *pfVar13;
  long lVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  float fVar16;
  Ptr PVar17;
  int local_8c;
  int c;
  float *val [4];
  int xoff [2];
  bool nextx;
  int x;
  int yoff [2];
  int iStack_40;
  bool nexty;
  int y;
  int witer;
  int oh;
  int ow;
  int ic;
  int ih;
  int iw;
  ConstPtr *img_local;
  Ptr *out;
  
  pIVar7 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar2 = ImageBase::width(pIVar7);
  pIVar7 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar3 = ImageBase::height(pIVar7);
  pIVar7 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  chans = ImageBase::channels(pIVar7);
  width = iVar2 * 2;
  iVar3 = iVar3 * 2;
  Image<float>::create();
  this_00 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<float>;
  TypedImageBase<float>::allocate(this_00,width,iVar3,chans);
  iStack_40 = 0;
  _Var15._M_pi = extraout_RDX;
  for (yoff[1] = 0; yoff[1] < iVar3; yoff[1] = yoff[1] + 1) {
    bVar1 = yoff[1] + 1 < iVar3;
    iVar4 = iVar2 * (yoff[1] >> 1);
    _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)bVar1;
    iVar5 = iVar2 * ((int)(yoff[1] + (uint)bVar1) >> 1);
    for (xoff[1] = 0; xoff[1] < width; xoff[1] = xoff[1] + 1) {
      iVar6 = (int)(xoff[1] + (uint)(xoff[1] + 1 < width)) >> 1;
      peVar8 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      pfVar9 = Image<float>::at(peVar8,iVar4 + (xoff[1] >> 1),0);
      peVar8 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      pfVar10 = Image<float>::at(peVar8,iVar4 + iVar6,0);
      peVar8 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      pfVar11 = Image<float>::at(peVar8,iVar5 + (xoff[1] >> 1),0);
      peVar8 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      pfVar12 = Image<float>::at(peVar8,iVar5 + iVar6,0);
      _Var15._M_pi = extraout_RDX_00;
      for (local_8c = 0; local_8c < chans; local_8c = local_8c + 1) {
        lVar14 = (long)local_8c;
        fVar16 = math::interpolate<float>
                           (pfVar9 + lVar14,pfVar10 + lVar14,pfVar11 + lVar14,pfVar12 + lVar14,0.25,
                            0.25,0.25,0.25);
        this_01 = std::
                  __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pfVar13 = Image<float>::at(this_01,iStack_40);
        *pfVar13 = fVar16;
        iStack_40 = iStack_40 + 1;
        _Var15._M_pi = extraout_RDX_01;
      }
    }
  }
  PVar17.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  PVar17.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar17.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
rescale_double_size_supersample (typename Image<T>::ConstPtr img)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = iw << 1;
    int const oh = ih << 1;

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    int witer = 0;
    for (int y = 0; y < oh; ++y)
    {
        bool nexty = (y + 1 < oh);
        int yoff[2] = { iw * (y >> 1), iw * ((y + nexty) >> 1) };
        for (int x = 0; x < ow; ++x)
        {
            bool nextx = (x + 1 < ow);
            int xoff[2] = { x >> 1, (x + nextx) >> 1 };
            T const* val[4] =
            {
                &img->at(yoff[0] + xoff[0], 0),
                &img->at(yoff[0] + xoff[1], 0),
                &img->at(yoff[1] + xoff[0], 0),
                &img->at(yoff[1] + xoff[1], 0)
            };

            for (int c = 0; c < ic; ++c, ++witer)
                out->at(witer) = math::interpolate
                    (val[0][c], val[1][c], val[2][c], val[3][c],
                    0.25f, 0.25f, 0.25f, 0.25f);
        }
    }

    return out;
}